

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

char * lws_json_purify(char *escaped,char *string,int len,int *in_used)

{
  int iVar1;
  char *pcVar2;
  char *local_40;
  char *q;
  char *p;
  int *in_used_local;
  int len_local;
  char *string_local;
  char *escaped_local;
  
  local_40 = escaped;
  q = string;
  in_used_local._4_4_ = len;
  if (string == (char *)0x0) {
    *escaped = '\0';
  }
  else {
    while( true ) {
      iVar1 = in_used_local._4_4_;
      if (*q != '\0') {
        in_used_local._4_4_ = in_used_local._4_4_ + -1;
      }
      if (*q == '\0' || iVar1 < 7) break;
      if (*q == '\t') {
        q = q + 1;
        pcVar2 = local_40 + 1;
        *local_40 = '\\';
        local_40 = local_40 + 2;
        *pcVar2 = 't';
      }
      else if (*q == '\n') {
        q = q + 1;
        pcVar2 = local_40 + 1;
        *local_40 = '\\';
        local_40 = local_40 + 2;
        *pcVar2 = 'n';
      }
      else if (*q == '\r') {
        q = q + 1;
        pcVar2 = local_40 + 1;
        *local_40 = '\\';
        local_40 = local_40 + 2;
        *pcVar2 = 'r';
      }
      else {
        if (((*q == '\"') || (*q == '\\')) || (*q < ' ')) {
          *local_40 = '\\';
          local_40[1] = 'u';
          local_40[2] = '0';
          local_40[3] = '0';
          local_40[4] = hex[(int)((int)*q >> 4 & 0xf)];
          local_40[5] = hex[(int)((int)*q & 0xf)];
          in_used_local._4_4_ = in_used_local._4_4_ + -5;
          local_40 = local_40 + 6;
        }
        else {
          *local_40 = *q;
          local_40 = local_40 + 1;
        }
        q = q + 1;
      }
    }
    *local_40 = '\0';
    if (in_used != (int *)0x0) {
      *in_used = (int)q - (int)string;
    }
  }
  return escaped;
}

Assistant:

const char *
lws_json_purify(char *escaped, const char *string, int len, int *in_used)
{
	const char *p = string;
	char *q = escaped;

	if (!p) {
		escaped[0] = '\0';
		return escaped;
	}

	while (*p && len-- > 6) {
		if (*p == '\t') {
			p++;
			*q++ = '\\';
			*q++ = 't';
			continue;
		}

		if (*p == '\n') {
			p++;
			*q++ = '\\';
			*q++ = 'n';
			continue;
		}

		if (*p == '\r') {
			p++;
			*q++ = '\\';
			*q++ = 'r';
			continue;
		}

		if (*p == '\"' || *p == '\\' || *p < 0x20) {
			*q++ = '\\';
			*q++ = 'u';
			*q++ = '0';
			*q++ = '0';
			*q++ = hex[((*p) >> 4) & 15];
			*q++ = hex[(*p) & 15];
			len -= 5;
			p++;
		} else
			*q++ = *p++;
	}
	*q = '\0';

	if (in_used)
		*in_used = lws_ptr_diff(p, string);

	return escaped;
}